

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::TestMutualRecursionA::ByteSizeLong(TestMutualRecursionA *this)

{
  int iVar1;
  anon_union_48_1_493b367e_for_TestMutualRecursionA_3 aVar2;
  uint uVar3;
  Rep *pRVar4;
  size_t sVar5;
  RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *this_00;
  size_t sVar6;
  RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *pRVar7;
  
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.subgroupr_;
  pRVar7 = this_00;
  if ((undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x1) !=
      (undefined1  [48])0x0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar7 = (RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)pRVar4->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar4 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)pRVar4->elements;
  }
  sVar6 = (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar7 != (RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar7 = (RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)
               &(pRVar7->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = TestMutualRecursionA_SubGroupR::ByteSizeLong
                      ((TestMutualRecursionA_SubGroupR *)
                       (pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    sVar6 = sVar6 + sVar5;
  }
  aVar2 = this->field_0;
  if (((undefined1  [48])aVar2 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar2 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      sVar5 = TestMutualRecursionB::ByteSizeLong((this->field_0)._impl_.bb_);
      uVar3 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [48])aVar2 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      sVar5 = TestMutualRecursionA_SubGroup::ByteSizeLong((this->field_0)._impl_.subgroup_);
      sVar6 = sVar6 + sVar5 + 2;
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestMutualRecursionA::ByteSizeLong() const {
  const TestMutualRecursionA& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMutualRecursionA)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestMutualRecursionA.SubGroupR subgroupr = 5 [features = {
    {
      total_size += 2UL * this_._internal_subgroupr_size();
      for (const auto& msg : this_._internal_subgroupr()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestMutualRecursionB bb = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bb_);
    }
    // .proto2_unittest.TestMutualRecursionA.SubGroup subgroup = 2 [features = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.subgroup_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}